

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O2

compile_errcode __thiscall ReturnStatement::Parse(ReturnStatement *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  compile_errcode cVar2;
  undefined4 uVar3;
  char *pcVar4;
  allocator local_51;
  string local_50;
  
  uVar3 = 0;
LAB_00135a82:
  SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
  switch(uVar3) {
  case 0:
    uVar3 = 1;
    if (SVar1 != RETURN_SYM) {
      return -1;
    }
    break;
  case 1:
    uVar3 = 2;
    if (SVar1 != L_CIRCLE_BRACKET_SYM) {
      if (SVar1 == SEMICOLON_SYM) {
        return 0;
      }
      pcVar4 = "expected a \'(\' or \';\'";
LAB_00135b20:
      log_tools_ptr = g_log_tools;
      std::__cxx11::string::string((string *)&local_50,pcVar4,&local_51);
      GrammaErrorLogs(log_tools_ptr,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      return -1;
    }
    break;
  case 2:
    cVar2 = Expression::Parse(&this->m_expression);
    if (cVar2 != 0) {
      pcVar4 = "expected a valid expression in return statement";
      goto LAB_00135b20;
    }
    Expression::LogOutput(&this->m_expression);
    uVar3 = 3;
    goto LAB_00135a82;
  case 3:
    uVar3 = 4;
    if (SVar1 != R_CIRCLE_BRACKET_SYM) {
      pcVar4 = "expected a \')\'";
      goto LAB_00135b20;
    }
    break;
  case 4:
    goto LAB_00135b48;
  }
  SymbolQueue::NextSymbol(handle_symbol_queue);
  goto LAB_00135a82;
LAB_00135b48:
  return 0;
}

Assistant:

compile_errcode ReturnStatement::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == RETURN_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    return COMPILE_OK;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a '(' or ';'");
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Parse()) == COMPILE_OK) {
                    state = 3;
                    m_expression.LogOutput();
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid expression in return statement");
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')'");
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_symbol_queue->NextSymbol();
    }
}